

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O3

void __thiscall
fasttext::ProductQuantizer::addcode
          (ProductQuantizer *this,Vector *x,uint8_t *codes,int32_t t,real alpha)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  pointer pfVar5;
  uint uVar6;
  float *pfVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  
  iVar1 = this->nsubq_;
  if (0 < (long)iVar1) {
    uVar2 = this->dsub_;
    iVar3 = this->ksub_;
    iVar4 = this->lastdsub_;
    pfVar5 = (this->centroids_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar7 = (x->data_).mem_;
    uVar9 = 0;
    uVar6 = uVar2;
    do {
      iVar10 = (int)uVar9 * iVar3;
      if (uVar9 == iVar1 - 1) {
        iVar10 = iVar10 * uVar2 + (uint)codes[uVar9 + (long)(t * iVar1)] * iVar4;
        uVar6 = this->lastdsub_;
      }
      else {
        iVar10 = (iVar10 + (uint)codes[uVar9 + (long)(t * iVar1)]) * uVar2;
      }
      if (0 < (int)uVar6) {
        uVar8 = 0;
        do {
          pfVar7[uVar8] = pfVar5[(long)iVar10 + uVar8] * alpha + pfVar7[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar6 != uVar8);
      }
      uVar9 = uVar9 + 1;
      pfVar7 = pfVar7 + (int)uVar2;
    } while (uVar9 != (long)iVar1);
  }
  return;
}

Assistant:

void ProductQuantizer::addcode(
    Vector& x,
    const uint8_t* codes,
    int32_t t,
    real alpha) const {
  auto d = dsub_;
  const uint8_t* code = codes + nsubq_ * t;
  for (auto m = 0; m < nsubq_; m++) {
    const real* c = get_centroids(m, code[m]);
    if (m == nsubq_ - 1) {
      d = lastdsub_;
    }
    for (auto n = 0; n < d; n++) {
      x[m * dsub_ + n] += alpha * c[n];
    }
  }
}